

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O2

void __thiscall TPZString::SimplifyWhiteSpace(TPZString *this)

{
  size_t sVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  
  sVar1 = Length(this);
  uVar2 = 0;
  uVar6 = 0;
  do {
    pcVar3 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
    ;
    if ((int)sVar1 - 1U <= uVar6) {
      pcVar3[uVar2] = '\0';
      return;
    }
    cVar4 = pcVar3[uVar6];
    if (cVar4 == ' ') {
      uVar5 = uVar6;
      if (uVar6 != 0) {
        pcVar3[uVar2] = ' ';
        uVar2 = uVar2 + 1;
        pcVar3 = (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.
                 fStore;
      }
      do {
        uVar6 = uVar5;
        cVar4 = pcVar3[uVar6 + 1];
        uVar5 = uVar6 + 1;
      } while (cVar4 == ' ');
LAB_00c0a773:
      pcVar3[uVar2] = cVar4;
      uVar5 = uVar6;
    }
    else {
      uVar5 = uVar2;
      if (uVar2 != uVar6) goto LAB_00c0a773;
    }
    uVar2 = uVar2 + 1;
    uVar6 = uVar5 + 1;
  } while( true );
}

Assistant:

void TPZString::SimplifyWhiteSpace()
{
	unsigned int i, newpos = 0;
	const unsigned int length = Length();
	char current = '0', next = '0';
	for (i = 0; i < length - 1; i++)
	{
		current = fStore[i];
		if (current == ' ')
		{
			if (i)
			{
				fStore[newpos] = ' ';
				newpos++;
			}
			next = fStore[i + 1];
			while (next == ' ')
			{
				i++;
				next = fStore[i + 1];
			}
			fStore[newpos] = next;
			newpos++;
		}
		else
		{
			if (newpos != i) fStore[newpos] = current;
			newpos++;
		}
	}
	fStore[newpos] = '\0';
}